

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerinfo.c
# Opt level: O1

_Bool so_peercred(int fd,int *pid,int *uid,int *gid)

{
  int iVar1;
  ucred cr;
  socklen_t crlen;
  int local_28;
  int local_24;
  int local_20;
  socklen_t local_1c;
  
  local_1c = 0xc;
  iVar1 = getsockopt(fd,1,0x11,&local_28,&local_1c);
  if (iVar1 == 0) {
    *pid = local_28;
    *uid = local_24;
    *gid = local_20;
  }
  return iVar1 == 0;
}

Assistant:

bool so_peercred(int fd, int *pid, int *uid, int *gid)
{
#if HAVE_SO_PEERCRED
    struct ucred cr;
    socklen_t crlen = sizeof(cr);
    if (getsockopt(fd, SOL_SOCKET, SO_PEERCRED, &cr, &crlen) == 0) {
        *pid = cr.pid;
        *uid = cr.uid;
        *gid = cr.gid;
        return true;
    }
#endif
    return false;
}